

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

void tinyformat::format<unsigned_int,double,double,double,double,double>
               (ostream *out,char *fmt,uint *args,double *args_1,double *args_2,double *args_3,
               double *args_4,double *args_5)

{
  long in_FS_OFFSET;
  FormatArg local_98;
  double *local_80;
  code *local_78;
  code *local_70;
  double *local_68;
  code *local_60;
  code *local_58;
  double *local_50;
  code *local_48;
  code *local_40;
  double *local_38;
  code *local_30;
  code *local_28;
  double *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.m_formatImpl = detail::FormatArg::formatImpl<unsigned_int>;
  local_98.m_toIntImpl = detail::FormatArg::toIntImpl<unsigned_int>;
  local_78 = detail::FormatArg::formatImpl<double>;
  local_70 = detail::FormatArg::toIntImpl<double>;
  local_60 = detail::FormatArg::formatImpl<double>;
  local_58 = detail::FormatArg::toIntImpl<double>;
  local_48 = detail::FormatArg::formatImpl<double>;
  local_40 = detail::FormatArg::toIntImpl<double>;
  local_38 = args_4;
  local_30 = detail::FormatArg::formatImpl<double>;
  local_28 = detail::FormatArg::toIntImpl<double>;
  local_20 = args_5;
  local_18 = detail::FormatArg::formatImpl<double>;
  local_10 = detail::FormatArg::toIntImpl<double>;
  local_98.m_value = args;
  local_80 = args_1;
  local_68 = args_2;
  local_50 = args_3;
  detail::formatImpl(out,fmt,&local_98,6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}